

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O1

void __thiscall rengine::OpenGLRenderer::initialize(OpenGLRenderer *this)

{
  Program *this_00;
  anon_struct_16_2_ef16f3e9_for_prog_alphaTexture *this_01;
  anon_struct_16_2_ef3471ee_for_prog_solid *this_02;
  BlurProgram *this_03;
  float *pfVar1;
  string *psVar2;
  anon_struct_32_2_57159ecd_for_prog_shadow *this_04;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  GLint GVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  ostream *poVar10;
  long *plVar11;
  bool bVar12;
  undefined1 auStack_c8 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> attrsV;
  int local_a8;
  int local_a4;
  GLint samples;
  GLint maxTexSize;
  GLint r;
  GLint g;
  GLint b;
  GLint a;
  GLint d;
  GLint s;
  vector<const_char_*,_std::allocator<const_char_*>_> attrsVT;
  char local_68 [8];
  char buffer [16];
  float data [8];
  
  data[2] = 1.0;
  data[3] = 0.0;
  data[4] = 1.0;
  data[5] = 1.0;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  data[0] = 0.0;
  data[1] = 1.0;
  glGenBuffers(1,&this->m_texCoordBuffer);
  glBindBuffer(0x8892,this->m_texCoordBuffer);
  glBufferData(0x8892,0x20,buffer + 8,0x88e4);
  glBindBuffer(0x8892,0);
  glGenBuffers(1,&this->m_vertexBuffer);
  _d = (pointer)0x0;
  attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer._8_8_ = anon_var_dwarf_1891c;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&d,(iterator)0x0,
             (char **)(buffer + 8));
  buffer._8_8_ = anon_var_dwarf_18929;
  if (attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&d,
               (iterator)
               attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start,(char **)(buffer + 8));
  }
  else {
    *attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
     super__Vector_impl_data._M_start = "aT";
    attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         attrsVT.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
  }
  auStack_c8 = (undefined1  [8])0x0;
  attrsV.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  attrsV.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer._8_8_ = anon_var_dwarf_1891c;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)auStack_c8,(iterator)0x0,
             (char **)(buffer + 8));
  this_00 = &this->prog_texture;
  OpenGLShaderProgram::initialize
            (&this_00->super_OpenGLShaderProgram,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); vT = aT; }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; varying highp vec2 vT; void main() { gl_FragColor = texture2D(t, vT); }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&d);
  GVar6 = OpenGLShaderProgram::resolve(&this_00->super_OpenGLShaderProgram,"m");
  (this->prog_texture).matrix = GVar6;
  OpenGLShaderProgram::initialize
            (&(this->prog_texture_bgr).super_OpenGLShaderProgram,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); vT = aT; }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; varying highp vec2 vT; void main() { gl_FragColor = texture2D(t, vT).zyxw; }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&d);
  GVar6 = OpenGLShaderProgram::resolve(&this_00->super_OpenGLShaderProgram,"m");
  (this->prog_texture_bgr).matrix = GVar6;
  this_01 = &this->prog_alphaTexture;
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)this_01,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); vT = aT; }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; uniform lowp float alpha; varying highp vec2 vT; void main() { gl_FragColor = texture2D(t, vT) * alpha; }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&d);
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_01,"m");
  (this->prog_alphaTexture).super_Program.matrix = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_01,"alpha");
  (this->prog_alphaTexture).alpha = GVar6;
  this_02 = &this->prog_solid;
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)this_02,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; uniform highp mat4 m; void main() { gl_Position = m * vec4(aV, 0, 1); }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp vec4 color; void main() { gl_FragColor = color; }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)auStack_c8);
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_02,"m");
  (this->prog_solid).super_Program.matrix = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_02,"color");
  (this->prog_solid).color = GVar6;
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)&this->prog_colorFilter,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); vT = aT; }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; uniform lowp mat4 CM; varying highp vec2 vT; void main() { gl_FragColor = CM * texture2D(t, vT); }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&d);
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_02,"m");
  (this->prog_colorFilter).super_Program.matrix = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)&this->prog_colorFilter,"CM");
  (this->prog_colorFilter).colorMatrix = GVar6;
  this_03 = &this->prog_blur;
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)this_03,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; uniform int radius; uniform highp vec4 dims; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); highp vec2 aw = dims.xy; highp vec2 cw = dims.zw; highp vec2 diff = (aw - cw) / aw; vT = (aT - diff/2.0) * (aw / cw); }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; uniform highp vec4 dims; uniform highp vec2 step; uniform highp float sigma; uniform int radius; varying highp vec2 vT; highp float gauss(float x) { return exp(-(x*x)/sigma); } void main() { highp float r = float(radius); highp float weights = 0.5 * gauss(r); highp vec4 result = weights * texture2D(t, vT - float(radius) * step); for (int i=-radius+1; i<=radius; i+=2) { highp float p1 = float(i); highp float w1 = gauss(p1); highp float p2 = float(i+1); highp float w2 = gauss(p2); highp float w = w1 + w2; highp float p = (p1 * w1 + p2 * w2) / w; result += w * texture2D(t, vT + p * step); weights += w; } gl_FragColor = result / weights; }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&d);
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_03,"m");
  (this->prog_blur).super_Program.matrix = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_03,"dims");
  (this->prog_blur).dims = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_03,"radius");
  (this->prog_blur).radius = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_03,"sigma");
  (this->prog_blur).sigma = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_03,"step");
  (this->prog_blur).step = GVar6;
  this_04 = &this->prog_shadow;
  OpenGLShaderProgram::initialize
            ((OpenGLShaderProgram *)this_04,
             "#define highp\n#define mediump\n#define lowp\nattribute highp vec2 aV; attribute highp vec2 aT; uniform highp mat4 m; uniform int radius; uniform highp vec4 dims; varying highp vec2 vT; void main() { gl_Position = m * vec4(aV, 0, 1); highp vec2 aw = dims.xy; highp vec2 cw = dims.zw; highp vec2 diff = (aw - cw) / aw; vT = (aT - diff/2.0) * (aw / cw); }"
             ,
             "#define highp\n#define mediump\n#define lowp\nuniform lowp sampler2D t; uniform highp vec4 color; uniform highp vec4 dims; uniform highp vec2 step; uniform highp float sigma; uniform int radius; varying highp vec2 vT; highp float gauss(float x) { return exp(-(x*x)/sigma); } void main() { highp float r = float(radius); highp float weights = 0.5 * gauss(r); highp float result = weights * texture2D(t, vT - float(radius) * step).a; for (int i=-radius+1; i<=radius; i+=2) { highp float p1 = float(i); highp float w1 = gauss(p1); highp float p2 = float(i+1); highp float w2 = gauss(p2); highp float w = w1 + w2; highp float p = (p1 * w1 + p2 * w2) / w; result += w * texture2D(t, vT + p * step).a; weights += w; } gl_FragColor = color * (result / weights); }"
             ,(vector<const_char_*,_std::allocator<const_char_*>_> *)&d);
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_04,"m");
  (this->prog_shadow).super_BlurProgram.super_Program.matrix = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_04,"dims");
  (this->prog_shadow).super_BlurProgram.dims = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_04,"radius");
  (this->prog_shadow).super_BlurProgram.radius = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_04,"sigma");
  (this->prog_shadow).super_BlurProgram.sigma = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_04,"step");
  (this->prog_shadow).super_BlurProgram.step = GVar6;
  GVar6 = OpenGLShaderProgram::resolve((OpenGLShaderProgram *)this_04,"color");
  (this->prog_shadow).color = GVar6;
  pcVar7 = (char *)glGetString(0x1f03);
  pcVar7 = strstr(pcVar7,"GL_ARB_framebuffer_sRGB");
  if (pcVar7 != (char *)0x0) {
    this->field_0x1f8 = this->field_0x1f8 | 4;
  }
  if (initialize::logged == false) {
    initialize::logged = true;
    glGetIntegerv(0xd33,&local_a4);
    glGetIntegerv(0x80a9,&local_a8);
    glGetIntegerv(0xd52,&samples);
    glGetIntegerv(0xd53,&maxTexSize);
    glGetIntegerv(0xd54,&r);
    glGetIntegerv(0xd55,&g);
    glGetIntegerv(0xd56,&b);
    glGetIntegerv(0xd57,&a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    pfVar1 = data + 2;
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(buffer + 8),local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"OpenGL",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(buffer + 8),local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - Renderer .........: ",0x17);
    pcVar7 = (char *)glGetString(0x1f01);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(buffer + 8),local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - Version ..........: ",0x17);
    pcVar7 = (char *)glGetString(0x1f02);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    psVar2 = (string *)(buffer + 8);
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>(psVar2,local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - R/G/B/A ..........: ",0x17);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,samples);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,maxTexSize);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,r);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,g);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>(psVar2,local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - Depth/Stencil ....: ",0x17);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,a);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>(psVar2,local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - Samples ..........: ",0x17);
    plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,local_a8);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>(psVar2,local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - Max Texture Size .: ",0x17);
    plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,local_a4);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>(psVar2,local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - SRGB Rendering ...: ",0x17);
    bVar12 = (this->field_0x1f8 & 4) == 0;
    pcVar7 = "yes";
    if (bVar12) {
      pcVar7 = "no";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,(ulong)bVar12 ^ 3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I [",3);
    lVar8 = std::chrono::_V2::system_clock::now();
    auVar3 = SEXT816(lVar8 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar4 = SEXT816(lVar8 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar5 = SEXT816(lVar8 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_68,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar8 / 1000000000) +
                          ((int)(auVar3._8_8_ >> 0xb) - (auVar3._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar8 / 1000000) +
                          ((int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar8 / 1000) +
                          ((int)(auVar5._8_8_ >> 7) - (auVar5._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = pfVar1;
    sVar9 = strlen(local_68);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(buffer + 8),local_68,local_68 + sVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)buffer._8_8_,CONCAT44(data[1],data[0]));
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," - Extensions .......: ",0x17);
    pcVar7 = (char *)glGetString(0x1f03);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
    }
    else {
      sVar9 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((float *)buffer._8_8_ != pfVar1) {
      operator_delete((void *)buffer._8_8_);
    }
  }
  if (auStack_c8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_c8);
  }
  if (_d != (pointer)0x0) {
    operator_delete(_d);
  }
  return;
}

Assistant:

inline void OpenGLRenderer::initialize()
{
    {   // Create a texture coordinate buffer
        const float data[] = { 0, 0, 0, 1, 1, 0, 1, 1 };
        glGenBuffers(1, &m_texCoordBuffer);
        glBindBuffer(GL_ARRAY_BUFFER, m_texCoordBuffer);
        glBufferData(GL_ARRAY_BUFFER, 8 * sizeof(float), data, GL_STATIC_DRAW);
        glBindBuffer(GL_ARRAY_BUFFER, 0);
    }

    // Create the vertex coordinate buffer
    glGenBuffers(1, &m_vertexBuffer);

    std::vector<const char *> attrsVT;
    attrsVT.push_back("aV");
    attrsVT.push_back("aT");

    std::vector<const char *> attrsV;
    attrsV.push_back("aV");

    // Default texture shader
    prog_texture.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture(), attrsVT);
    prog_texture.matrix = prog_texture.resolve("m");

    // BGRA texture shader
    prog_texture_bgr.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture_bgra(), attrsVT);
    prog_texture_bgr.matrix = prog_texture.resolve("m");

    // Alpha texture shader
    prog_alphaTexture.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture_alpha(), attrsVT);
    prog_alphaTexture.matrix = prog_alphaTexture.resolve("m");
    prog_alphaTexture.alpha = prog_alphaTexture.resolve("alpha");

    // Solid color shader...
    prog_solid.initialize(openglrenderer_vsh_solid(), openglrenderer_fsh_solid(), attrsV);
    prog_solid.matrix = prog_solid.resolve("m");
    prog_solid.color = prog_solid.resolve("color");

    // Color filter shader..
    prog_colorFilter.initialize(openglrenderer_vsh_texture(), openglrenderer_fsh_texture_colorfilter(), attrsVT);
    prog_colorFilter.matrix = prog_solid.resolve("m");
    prog_colorFilter.colorMatrix = prog_colorFilter.resolve("CM");

    // Blur shader
    prog_blur.initialize(openglrenderer_vsh_blur(), openglrenderer_fsh_blur(), attrsVT);
    prog_blur.matrix = prog_blur.resolve("m");
    prog_blur.dims = prog_blur.resolve("dims");
    prog_blur.radius = prog_blur.resolve("radius");
    prog_blur.sigma = prog_blur.resolve("sigma");
    prog_blur.step = prog_blur.resolve("step");

    // Shadow shader
    prog_shadow.initialize(openglrenderer_vsh_blur(), openglrenderer_fsh_shadow(), attrsVT);
    prog_shadow.matrix = prog_shadow.resolve("m");
    prog_shadow.dims = prog_shadow.resolve("dims");
    prog_shadow.radius = prog_shadow.resolve("radius");
    prog_shadow.sigma = prog_shadow.resolve("sigma");
    prog_shadow.step = prog_shadow.resolve("step");
    prog_shadow.color = prog_shadow.resolve("color");

    // Using srgb for everything needs a bit more thought as it results in
    // really washed out colors for rectangles and image textures.
    const char *extensions = (const char *) glGetString(GL_EXTENSIONS);
    if (std::strstr(extensions, "GL_ARB_framebuffer_sRGB")) {
        m_srgb = true;
        // glEnable(GL_FRAMEBUFFER_SRGB);
    }

#ifdef RENGINE_LOG_INFO
    static bool logged = false;
    if (!logged) {
        logged = true;
        GLint samples, maxTexSize;
        GLint r, g, b, a, d, s;
        glGetIntegerv(GL_MAX_TEXTURE_SIZE, &maxTexSize);
        glGetIntegerv(GL_SAMPLES, &samples);
        glGetIntegerv(GL_RED_BITS, &r);
        glGetIntegerv(GL_GREEN_BITS, &g);
        glGetIntegerv(GL_BLUE_BITS, &b);
        glGetIntegerv(GL_ALPHA_BITS, &a);
        glGetIntegerv(GL_DEPTH_BITS, &d);
        glGetIntegerv(GL_STENCIL_BITS, &s);
        logi << "OpenGL" << std::endl;
        logi << " - Renderer .........: " << glGetString(GL_RENDERER) << std::endl;
        logi << " - Version ..........: " << glGetString(GL_VERSION) << std::endl;
        logi << " - R/G/B/A ..........: " << r << " " << g << " " << b << " " << a << std::endl;
        logi << " - Depth/Stencil ....: " << d << " " << s << std::endl;
        logi << " - Samples ..........: " << samples << std::endl;
        logi << " - Max Texture Size .: " << maxTexSize << std::endl;
        logi << " - SRGB Rendering ...: " << (m_srgb ? "yes" : "no") << std::endl;
        logi << " - Extensions .......: " << glGetString(GL_EXTENSIONS) << std::endl;
    }
#endif

}